

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

clock_constraint_t tchecker::operator-(clock_constraint_t *c)

{
  integer_t iVar1;
  int iVar2;
  ineq_cmp_t iVar3;
  clock_id_t id1;
  clock_id_t id2;
  invalid_argument *this;
  ineq_cmp_t neg_cmp;
  clock_constraint_t *c_local;
  
  iVar1 = clock_constraint_t::value(c);
  iVar2 = std::numeric_limits<int>::min();
  if (iVar1 == iVar2) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"clock constraint negation cannot be represented");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar3 = clock_constraint_t::comparator(c);
  id1 = clock_constraint_t::id2(c);
  id2 = clock_constraint_t::id1(c);
  iVar1 = clock_constraint_t::value(c);
  clock_constraint_t::clock_constraint_t
            ((clock_constraint_t *)&c_local,id1,id2,(uint)(iVar3 != LE),-iVar1);
  return _c_local;
}

Assistant:

tchecker::clock_constraint_t operator-(tchecker::clock_constraint_t const & c)
{
  if (c.value() == std::numeric_limits<tchecker::integer_t>::min())
    throw std::invalid_argument("clock constraint negation cannot be represented");
  tchecker::ineq_cmp_t neg_cmp = (c.comparator() == tchecker::LE ? tchecker::LT : tchecker::LE);
  return tchecker::clock_constraint_t{c.id2(), c.id1(), neg_cmp, static_cast<tchecker::integer_t>(-c.value())};
}